

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

Number * __thiscall LiteScript::Number::operator=(Number *this,Number *number)

{
  Number *number_local;
  Number *this_local;
  
  this->numeric_type = number->numeric_type;
  if (this->numeric_type == '\0') {
    this->value = number->value;
  }
  else {
    this->value = number->value;
  }
  return this;
}

Assistant:

LiteScript::Number& LiteScript::Number::operator=(const LiteScript::Number& number) {
    this->numeric_type = number.numeric_type;
    if (this->numeric_type == 0)
        this->value.integer = number.value.integer;
    else
        this->value.flotting = number.value.flotting;
    return *this;
}